

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O3

void amrex::Add<amrex::EBCellFlagFab,void>
               (FabArray<amrex::EBCellFlagFab> *dst,FabArray<amrex::EBCellFlagFab> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  IntVect *pIVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  MFIter mfi;
  Array4<amrex::EBCellFlag> dstFab;
  Array4<const_amrex::EBCellFlag> srcFab;
  Box local_15c;
  uint local_140;
  int local_13c;
  int local_138;
  int local_134;
  IntVect *local_130;
  FabArray<amrex::EBCellFlagFab> *local_128;
  FabArray<amrex::EBCellFlagFab> *local_120;
  ulong local_118;
  MFIter local_110;
  Array4<amrex::EBCellFlag> local_b0;
  Array4<const_amrex::EBCellFlag> local_70;
  
  local_128 = dst;
  local_120 = src;
  MFIter::MFIter(&local_110,&dst->super_FabArrayBase,true);
  pIVar4 = nghost;
  if (local_110.currentIndex < local_110.endIndex) {
    do {
      local_130 = pIVar4;
      MFIter::growntilebox(&local_15c,&local_110,nghost);
      if ((((local_15c.smallend.vect[0] <= local_15c.bigend.vect[0]) &&
           (local_15c.smallend.vect[1] <= local_15c.bigend.vect[1])) &&
          (local_15c.smallend.vect[2] <= local_15c.bigend.vect[2])) && (local_15c.btype.itype < 8))
      {
        FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                  (&local_70,local_120,&local_110);
        FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                  (&local_b0,local_128,&local_110);
        iVar3 = local_15c.bigend.vect[2];
        iVar2 = local_15c.bigend.vect[1];
        iVar1 = local_15c.smallend.vect[0];
        nghost = local_130;
        if (0 < numcomp) {
          local_138 = local_15c.smallend.vect[1];
          local_140 = local_15c.smallend.vect[2];
          local_134 = local_15c.bigend.vect[0];
          iVar8 = local_15c.bigend.vect[0] - local_15c.smallend.vect[0];
          iVar5 = 0;
          do {
            uVar6 = local_140;
            local_13c = iVar5;
            if ((int)local_140 <= iVar3) {
              do {
                local_118 = (ulong)uVar6;
                iVar5 = local_138;
                if (local_138 <= iVar2) {
                  do {
                    iVar7 = iVar8 + 1;
                    if (iVar1 <= local_134) {
                      do {
                        Abort_host("EBCellFlag::operator+= not supported");
                        iVar7 = iVar7 + -1;
                      } while (iVar7 != 0);
                    }
                    bVar9 = iVar5 != iVar2;
                    iVar5 = iVar5 + 1;
                  } while (bVar9);
                }
                uVar6 = (int)local_118 + 1;
              } while ((int)local_118 != iVar3);
            }
            iVar5 = local_13c + 1;
            nghost = local_130;
          } while (iVar5 != numcomp);
        }
      }
      MFIter::operator++(&local_110);
      pIVar4 = local_130;
    } while (local_110.currentIndex < local_110.endIndex);
  }
  MFIter::~MFIter(&local_110);
  return;
}

Assistant:

void
Add (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) += srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) += srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}